

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.hpp
# Opt level: O2

shared_ptr<helics::BrokerFactory::BrokerBuilder>
helics::BrokerFactory::
addBrokerType<helics::NetworkBroker<helics::tcp::TcpComms,(gmlc::networking::InterfaceTypes)0,6>>
          (string_view brokerTypeName,int code)

{
  int in_ECX;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<helics::BrokerFactory::BrokerBuilder,_(__gnu_cxx::_Lock_policy)2> *__r;
  string_view name;
  shared_ptr<helics::BrokerFactory::BrokerBuilder> sVar1;
  shared_ptr<helics::BrokerFactory::BrokerTypeBuilder<helics::NetworkBroker<helics::tcp::TcpComms,_(gmlc::networking::InterfaceTypes)0,_6>_>_>
  bld;
  __shared_ptr<helics::BrokerFactory::BrokerBuilder,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  name._M_str._4_4_ = in_register_00000014;
  name._M_str._0_4_ = code;
  name._M_len = brokerTypeName._M_str;
  __r = (__shared_ptr<helics::BrokerFactory::BrokerBuilder,_(__gnu_cxx::_Lock_policy)2> *)
        brokerTypeName._M_len;
  std::
  make_shared<helics::BrokerFactory::BrokerTypeBuilder<helics::NetworkBroker<helics::tcp::TcpComms,(gmlc::networking::InterfaceTypes)0,6>>>
            ();
  std::
  static_pointer_cast<helics::BrokerFactory::BrokerBuilder,helics::BrokerFactory::BrokerTypeBuilder<helics::NetworkBroker<helics::tcp::TcpComms,(gmlc::networking::InterfaceTypes)0,6>>>
            ((shared_ptr<helics::BrokerFactory::BrokerTypeBuilder<helics::NetworkBroker<helics::tcp::TcpComms,_(gmlc::networking::InterfaceTypes)0,_6>_>_>
              *)__r);
  std::__shared_ptr<helics::BrokerFactory::BrokerBuilder,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_48,__r);
  defineBrokerBuilder((shared_ptr<helics::BrokerFactory::BrokerBuilder> *)&_Stack_48,name,in_ECX);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  sVar1.super___shared_ptr<helics::BrokerFactory::BrokerBuilder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::BrokerFactory::BrokerBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)__r;
  return (shared_ptr<helics::BrokerFactory::BrokerBuilder>)
         sVar1.super___shared_ptr<helics::BrokerFactory::BrokerBuilder,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BrokerBuilder> addBrokerType(std::string_view brokerTypeName, int code)
    {
        auto bld = std::make_shared<BrokerTypeBuilder<BrokerTYPE>>();
        std::shared_ptr<BrokerBuilder> bbld = std::static_pointer_cast<BrokerBuilder>(bld);
        defineBrokerBuilder(bbld, brokerTypeName, code);
        return bbld;
    }